

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O1

void list_store_delete(t_list_store *x,t_floatarg f1,t_floatarg f2)

{
  int *piVar1;
  t_listelem *ptVar2;
  uint uVar3;
  t_listelem *ptVar4;
  t_gpointer *ptVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  
  uVar9 = (uint)f1;
  if (((int)uVar9 < 0) ||
     (iVar7 = (x->x_alist).l_n, uVar3 = iVar7 - uVar9, uVar3 == 0 || iVar7 < (int)uVar9)) {
    pd_error(x,"list_store_delete: index %d out of range",(ulong)uVar9);
    return;
  }
  uVar6 = (uint)f2;
  uVar8 = uVar6;
  if ((int)uVar3 < (int)uVar6) {
    uVar8 = uVar3;
  }
  if ((int)uVar6 < 0) {
    uVar8 = uVar3;
  }
  uVar3 = 1;
  if (uVar6 != 0) {
    uVar3 = uVar8;
  }
  ptVar2 = (x->x_alist).l_vec;
  if (((x->x_alist).l_npointer != 0) && (0 < (int)uVar3)) {
    lVar10 = 0;
    do {
      if (*(int *)((long)&ptVar2[uVar9].l_a.a_type + lVar10) == 3) {
        gpointer_unset(*(t_gpointer **)((long)&ptVar2[uVar9].l_a.a_w + lVar10));
        piVar1 = &(x->x_alist).l_npointer;
        *piVar1 = *piVar1 + -1;
      }
      lVar10 = lVar10 + 0x28;
    } while ((ulong)uVar3 * 0x28 != lVar10);
  }
  ptVar4 = (x->x_alist).l_vec + uVar9;
  memmove(ptVar4,ptVar4 + (int)uVar3,((long)(x->x_alist).l_n - (long)(int)uVar9) * 0x28);
  lVar10 = (long)(x->x_alist).l_n;
  ptVar4 = (t_listelem *)resizebytes((x->x_alist).l_vec,lVar10 * 0x28,(lVar10 - (int)uVar3) * 0x28);
  (x->x_alist).l_vec = ptVar4;
  if (ptVar4 == (t_listelem *)0x0) {
    (x->x_alist).l_n = 0;
    pd_error((void *)0x0,"list: out of memory");
    return;
  }
  if ((x->x_alist).l_npointer != 0) {
    uVar8 = (x->x_alist).l_n;
    if (ptVar4 == ptVar2) {
      if (uVar8 != uVar9 + uVar3) {
        iVar7 = (uVar9 + uVar3) - uVar8;
        ptVar2 = (x->x_alist).l_vec + uVar9;
        do {
          ptVar5 = &ptVar2->l_p;
          if (*(int *)((long)(ptVar5 + -1) + 8) == 3) {
            *(t_gpointer **)((long)(ptVar5 + -1) + 0x10) = ptVar5;
          }
          ptVar2 = (t_listelem *)(ptVar5 + 1);
          iVar7 = iVar7 + 1;
        } while (iVar7 != 0);
      }
    }
    else if (uVar8 != uVar3) {
      ptVar2 = (x->x_alist).l_vec;
      iVar7 = uVar3 - uVar8;
      do {
        ptVar5 = &ptVar2->l_p;
        if (*(int *)((long)(ptVar5 + -1) + 8) == 3) {
          *(t_gpointer **)((long)(ptVar5 + -1) + 0x10) = ptVar5;
        }
        ptVar2 = (t_listelem *)(ptVar5 + 1);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0);
    }
  }
  piVar1 = &(x->x_alist).l_n;
  *piVar1 = *piVar1 - uVar3;
  return;
}

Assistant:

static void list_store_delete(t_list_store *x, t_floatarg f1, t_floatarg f2)
{
    int i, max, index = (int)f1, n = (int)f2;
    t_listelem *oldptr = x->x_alist.l_vec;
    if (index < 0 || index >= x->x_alist.l_n)
    {
        pd_error(x, "list_store_delete: index %d out of range", index);
        return;
    }
    max = x->x_alist.l_n - index;
    if (!n)
        n = 1; /* default */
    else if (n < 0 || n > max)
        n = max; /* till the end of the list */

        /* unset pointers for elements which are to be deleted */
    if (x->x_alist.l_npointer)
    {
        t_listelem *vec = x->x_alist.l_vec + index;
        for (i = 0; i < n; i++)
        {
            if (vec[i].l_a.a_type == A_POINTER)
            {
                gpointer_unset(vec[i].l_a.a_w.w_gpointer);
                x->x_alist.l_npointer--;
            }
        }
    }
        /* shift elements (after the deleted elements) to the left */
    memmove(x->x_alist.l_vec + index, x->x_alist.l_vec + index + n,
        (x->x_alist.l_n - index) * sizeof(*x->x_alist.l_vec));
        /* shrink memory */
    if (!(x->x_alist.l_vec = (t_listelem *)resizebytes(x->x_alist.l_vec,
        (x->x_alist.l_n) * sizeof(*x->x_alist.l_vec),
        (x->x_alist.l_n - n) * sizeof(*x->x_alist.l_vec))))
    {
        x->x_alist.l_n = 0;
        pd_error(0, "list: out of memory");
        return;
    }
    if (x->x_alist.l_npointer)
    {
            /* fix all gpointers in case resizebytes() has moved the alist in memory */
        if (x->x_alist.l_vec != oldptr)
            alist_restore_gpointers(&x->x_alist, 0, x->x_alist.l_n - n);
        else /* only fix gpointers after index (because of of memmove()) */
            alist_restore_gpointers(&x->x_alist, index, x->x_alist.l_n - index - n);
    }
    x->x_alist.l_n -= n;
}